

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::GridRenderTestCase
          (GridRenderTestCase *this,TestContext *testCtx,string *name,string *description,
          Flags flags)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  int local_b10;
  int local_b0c;
  MessageBuilder local_b08;
  MessageBuilder local_988;
  int local_808;
  int local_804;
  int numSliceNodes;
  int numSliceNodesOutputLimit;
  int numSliceNodesComponentLimit;
  int numOutputLimit;
  int numComponentLimit;
  int geometryPrimitivesOutPerPrimitive;
  int geometryVerticesPerPrimitive;
  int numVerticesPerInvocation;
  int numComponentsPerVertex;
  bool separatePrimitives;
  MessageBuilder msg;
  int local_4dc;
  int local_4d8;
  int geometryTotalOutputComponents;
  int geometryOutputVertices;
  int geometryOutputComponents;
  MessageBuilder local_4c8;
  MessageBuilder local_348;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  Flags local_2c;
  string *psStack_28;
  Flags flags_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  GridRenderTestCase *this_local;
  
  local_2c = flags;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GridRenderTestCase_016b20e8;
  this->m_flags = local_2c;
  iVar1 = 5;
  if ((this->m_flags & 1) != 0) {
    iVar1 = 0x40;
  }
  this->m_tessGenLevel = iVar1;
  iVar1 = 4;
  if ((this->m_flags & 4) != 0) {
    iVar1 = 0x20;
  }
  this->m_numGeometryInvocations = iVar1;
  iVar1 = 1;
  if ((this->m_flags & 0x40) != 0) {
    iVar1 = 8;
  }
  this->m_numLayers = iVar1;
  pTVar2 = tcu::TestContext::getLog((TestContext *)name_local);
  tcu::TestLog::operator<<(&local_1b0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1b0,
                      (char (*) [85])
                      "Testing tessellation and geometry shaders that output a large number of primitives.\n"
                     );
  local_1c8[0] = tcu::TestNode::getDescription((TestNode *)this);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  if ((this->m_flags & 0x40) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_348,(char (*) [44])"Rendering to 2d texture array, numLayers = ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_numLayers);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
  }
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4c8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_4c8,(char (*) [21])"Tessellation level: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_tessGenLevel);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])", mode = quad.\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [28])"\tEach input patch produces ");
  geometryOutputComponents = this->m_tessGenLevel * this->m_tessGenLevel;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&geometryOutputComponents);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x1302799);
  geometryOutputVertices = this->m_tessGenLevel * this->m_tessGenLevel * 2;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&geometryOutputVertices);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" triangles)\n");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  geometryTotalOutputComponents = 0;
  local_4d8 = 0;
  local_4dc = 0;
  if ((this->m_flags & 2) == 0) {
    local_4d8 = 0x10;
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&msg.field_0x178,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&msg.field_0x178,
                        (char (*) [53])"Using geometry shader minimum maximum output limits.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&msg.field_0x178);
    local_4d8 = 0x100;
  }
  geometryTotalOutputComponents = 0x40;
  local_4dc = 0x400;
  if (((this->m_flags & 2) != 0) || ((this->m_flags & 4) != 0)) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::MessageBuilder::MessageBuilder((MessageBuilder *)&numComponentsPerVertex,pTVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numComponentsPerVertex,
               (char (*) [46])"Geometry shader, targeting following limits:\n");
    if ((this->m_flags & 2) != 0) {
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&numComponentsPerVertex,
                          (char (*) [32])"\tmaxGeometryOutputComponents = ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&geometryTotalOutputComponents);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [30])"\tmaxGeometryOutputVertices = ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_4d8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [37])"\tmaxGeometryTotalOutputComponents = ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_4dc);
      tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
    }
    if ((this->m_flags & 4) != 0) {
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&numComponentsPerVertex,
                          (char (*) [33])"\tmaxGeometryShaderInvocations = ");
      tcu::MessageBuilder::operator<<(pMVar3,&this->m_numGeometryInvocations);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numComponentsPerVertex,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&numComponentsPerVertex);
  }
  numVerticesPerInvocation._3_1_ = (this->m_flags & 0x20) != 0;
  geometryVerticesPerPrimitive = 8;
  geometryPrimitivesOutPerPrimitive = 0;
  numComponentLimit = 0;
  numOutputLimit = 0;
  if ((bool)numVerticesPerInvocation._3_1_) {
    iVar1 = local_4dc;
    if (local_4dc < 0) {
      iVar1 = local_4dc + 0x1f;
    }
    numSliceNodesComponentLimit = iVar1 >> 5;
    iVar1 = local_4d8;
    if (local_4d8 < 0) {
      iVar1 = local_4d8 + 3;
    }
    numSliceNodesOutputLimit = iVar1 >> 2;
    iVar1 = de::min<int>(numSliceNodesComponentLimit,numSliceNodesOutputLimit);
    this->m_numGeometryPrimitivesPerInvocation = iVar1;
    geometryPrimitivesOutPerPrimitive = this->m_numGeometryPrimitivesPerInvocation << 2;
  }
  else {
    iVar1 = local_4dc;
    if (local_4dc < 0) {
      iVar1 = local_4dc + 0xf;
    }
    numSliceNodes = iVar1 >> 4;
    local_804 = local_4d8 / 2;
    local_808 = de::min<int>(numSliceNodes,local_804);
    geometryPrimitivesOutPerPrimitive = local_808 << 1;
    this->m_numGeometryPrimitivesPerInvocation = (local_808 + -1) * 2;
  }
  numComponentLimit = geometryPrimitivesOutPerPrimitive * this->m_numGeometryInvocations;
  numOutputLimit = this->m_numGeometryPrimitivesPerInvocation * this->m_numGeometryInvocations;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_988,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_988,(char (*) [18])"Geometry shader:\n");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [44])"\tTotal output vertex count per invocation: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&geometryPrimitivesOutPerPrimitive);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [47])"\tTotal output primitive count per invocation: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_numGeometryPrimitivesPerInvocation);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [39])"\tNumber of invocations per primitive: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_numGeometryInvocations);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [49])"\tTotal output vertex count per input primitive: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&numComponentLimit);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [52])"\tTotal output primitive count per input primitive: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&numOutputLimit);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_988);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_b08,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_b08,(char (*) [10])"Program:\n");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [55])
                             "\tTotal program output vertices count per input patch: ");
  local_b0c = this->m_tessGenLevel * this->m_tessGenLevel * numComponentLimit * 2;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_b0c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [56])
                             "\tTotal program output primitive count per input patch: ");
  local_b10 = this->m_tessGenLevel * this->m_tessGenLevel * numOutputLimit * 2;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_b10);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x1387264);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b08);
  return;
}

Assistant:

GridRenderTestCase::GridRenderTestCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, const Flags flags)
	: TestCase					(testCtx, name, description)
	, m_flags					(flags)
	, m_tessGenLevel			((m_flags & FLAG_TESSELLATION_MAX_SPEC)			? 64 : 5)
	, m_numGeometryInvocations	((m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)	? 32 : 4)
	, m_numLayers				((m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)		? 8  : 1)
{
	DE_ASSERT(((flags & (FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS)) != 0) == ((flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0));

	testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellation and geometry shaders that output a large number of primitives.\n"
		<< getDescription()
		<< tcu::TestLog::EndMessage;

	if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to 2d texture array, numLayers = " << m_numLayers << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Tessellation level: " << m_tessGenLevel << ", mode = quad.\n"
		<< "\tEach input patch produces " << (m_tessGenLevel*m_tessGenLevel) << " (" << (m_tessGenLevel*m_tessGenLevel*2) << " triangles)\n"
		<< tcu::TestLog::EndMessage;

	int geometryOutputComponents	  = 0;
	int geometryOutputVertices		  = 0;
	int geometryTotalOutputComponents = 0;

	if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using geometry shader minimum maximum output limits." << tcu::TestLog::EndMessage;

		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 256;
		geometryTotalOutputComponents = 1024;
	}
	else
	{
		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 16;
		geometryTotalOutputComponents = 1024;
	}

	if ((m_flags & FLAG_GEOMETRY_MAX_SPEC) || (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC))
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Geometry shader, targeting following limits:\n";

		if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
			msg	<< "\tmaxGeometryOutputComponents = "	   << geometryOutputComponents << "\n"
				<< "\tmaxGeometryOutputVertices = "		   << geometryOutputVertices << "\n"
				<< "\tmaxGeometryTotalOutputComponents = " << geometryTotalOutputComponents << "\n";

		if (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)
			msg << "\tmaxGeometryShaderInvocations = "	   << m_numGeometryInvocations;

		msg << tcu::TestLog::EndMessage;
	}

	const bool	separatePrimitives				  = (m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0;
	const int	numComponentsPerVertex			  = 8; // vec4 pos, vec4 color
	int			numVerticesPerInvocation		  = 0;
	int			geometryVerticesPerPrimitive	  = 0;
	int			geometryPrimitivesOutPerPrimitive = 0;

	if (separatePrimitives)
	{
		const int	numComponentLimit		 = geometryTotalOutputComponents / (4 * numComponentsPerVertex);
		const int	numOutputLimit			 = geometryOutputVertices / 4;

		m_numGeometryPrimitivesPerInvocation = de::min(numComponentLimit, numOutputLimit);
		numVerticesPerInvocation			 = m_numGeometryPrimitivesPerInvocation * 4;
	}
	else
	{
		// If FLAG_GEOMETRY_SEPARATE_PRIMITIVES is not set, geometry shader fills a rectangle area in slices.
		// Each slice is a triangle strip and is generated by a single shader invocation.
		// One slice with 4 segment ends (nodes) and 3 segments:
		//    .__.__.__.
		//    |\ |\ |\ |
		//    |_\|_\|_\|

		const int	numSliceNodesComponentLimit	= geometryTotalOutputComponents / (2 * numComponentsPerVertex);			// each node 2 vertices
		const int	numSliceNodesOutputLimit	= geometryOutputVertices / 2;											// each node 2 vertices
		const int	numSliceNodes				= de::min(numSliceNodesComponentLimit, numSliceNodesOutputLimit);

		numVerticesPerInvocation				= numSliceNodes * 2;
		m_numGeometryPrimitivesPerInvocation	= (numSliceNodes - 1) * 2;
	}

	geometryVerticesPerPrimitive	  = numVerticesPerInvocation * m_numGeometryInvocations;
	geometryPrimitivesOutPerPrimitive = m_numGeometryPrimitivesPerInvocation * m_numGeometryInvocations;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Geometry shader:\n"
		<< "\tTotal output vertex count per invocation: "		  << numVerticesPerInvocation << "\n"
		<< "\tTotal output primitive count per invocation: "	  << m_numGeometryPrimitivesPerInvocation << "\n"
		<< "\tNumber of invocations per primitive: "			  << m_numGeometryInvocations << "\n"
		<< "\tTotal output vertex count per input primitive: "	  << geometryVerticesPerPrimitive << "\n"
		<< "\tTotal output primitive count per input primitive: " << geometryPrimitivesOutPerPrimitive << "\n"
		<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Program:\n"
		<< "\tTotal program output vertices count per input patch: "  << (m_tessGenLevel*m_tessGenLevel*2 * geometryVerticesPerPrimitive) << "\n"
		<< "\tTotal program output primitive count per input patch: " << (m_tessGenLevel*m_tessGenLevel*2 * geometryPrimitivesOutPerPrimitive) << "\n"
		<< tcu::TestLog::EndMessage;
}